

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

void __thiscall
CGL::SceneObjects::AreaLight::AreaLight
          (AreaLight *this,Vector3D *rad,Vector3D *pos,Vector3D *dir,Vector3D *dim_x,Vector3D *dim_y
          )

{
  Vector3D *in_RCX;
  Vector3D *in_RDX;
  Vector3D *in_RSI;
  SceneLight *in_RDI;
  Vector3D *in_R8;
  Vector3D *in_R9;
  double dVar1;
  double dVar2;
  UniformGridSampler2D *in_stack_ffffffffffffff70;
  
  SceneLight::SceneLight(in_RDI);
  in_RDI->_vptr_SceneLight = (_func_int **)&PTR_sample_L_00140970;
  Vector3D::Vector3D((Vector3D *)(in_RDI + 2),in_RSI);
  Vector3D::Vector3D((Vector3D *)(in_RDI + 6),in_RDX);
  Vector3D::Vector3D((Vector3D *)(in_RDI + 10),in_RCX);
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0xe),in_R8);
  Vector3D::Vector3D((Vector3D *)(in_RDI + 0x12),in_R9);
  UniformGridSampler2D::UniformGridSampler2D(in_stack_ffffffffffffff70);
  dVar1 = Vector3D::norm((Vector3D *)0x11f8f9);
  dVar2 = Vector3D::norm((Vector3D *)0x11f90b);
  in_RDI[0x17]._vptr_SceneLight = (_func_int **)(dVar1 * dVar2);
  return;
}

Assistant:

AreaLight::AreaLight(const Vector3D rad, 
                     const Vector3D pos,   const Vector3D dir, 
                     const Vector3D dim_x, const Vector3D dim_y)
  : radiance(rad), position(pos), direction(dir),
    dim_x(dim_x), dim_y(dim_y), area(dim_x.norm() * dim_y.norm()) { }